

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

void __thiscall Entity::rotateClockwise(Entity *this)

{
  undefined8 *puVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar3 = 0;
  if (this->rotation < 0x10e) {
    iVar3 = this->rotation + 0x5a;
  }
  this->rotation = iVar3;
  puVar1 = (undefined8 *)(**(code **)(*(long *)this + 0x40))();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Entity::rotateClockwise() {
    rotation = rotation < 270 ? (rotation + 90) : 0;
    cout << *toString() << endl;
}